

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O0

void sbfTport_adjustWeight(sbfTport tport,sbfMwThread thread,int change)

{
  uint uVar1;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  u_int index;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x138));
  uVar1 = sbfMw_getThreadIndex(in_RSI);
  *(int *)(in_RDI + 0x38 + (ulong)uVar1 * 4) = in_EDX + *(int *)(in_RDI + 0x38 + (ulong)uVar1 * 4);
  sbfLog_log(*(undefined8 *)(in_RDI + 8),0,"thread %u weight is %u (%+d)",uVar1,
             *(undefined4 *)(in_RDI + 0x38 + (ulong)uVar1 * 4),in_EDX);
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x138));
  return;
}

Assistant:

void
sbfTport_adjustWeight (sbfTport tport, sbfMwThread thread, int change)
{
    u_int index;

    sbfMutex_lock (&tport->mWeightsLock);

    index = sbfMw_getThreadIndex (thread);
    tport->mWeights[index] += change;

    sbfLog_debug (tport->mLog,
                  "thread %u weight is %u (%+d)",
                  index,
                  tport->mWeights[index],
                  change);

    sbfMutex_unlock (&tport->mWeightsLock);
}